

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void TPZSkylMatrix<double>::InitializeElem
               (TPZVec<long> *skyline,TPZVec<double> *storage,TPZVec<double_*> *point)

{
  long lVar1;
  int64_t index;
  int64_t iVar2;
  double *pdVar3;
  double **ppdVar4;
  long *plVar5;
  TPZVec<double_*> *in_RDX;
  TPZVec<double> *in_RSI;
  TPZVec<long> *in_RDI;
  TPZVec<double> *unaff_retaddr;
  int64_t i;
  int64_t nel;
  int64_t dim;
  TPZVec<long> *in_stack_ffffffffffffffc0;
  long local_38;
  
  index = TPZVec<long>::NElements(in_RDI);
  iVar2 = NumElements(in_stack_ffffffffffffffc0);
  (*in_RSI->_vptr_TPZVec[3])(in_RSI,iVar2);
  TPZVec<double>::Fill(unaff_retaddr,(double *)in_RDI,(int64_t)in_RSI,(int64_t)in_RDX);
  (*in_RDX->_vptr_TPZVec[3])(in_RDX,index + 1);
  if (index == 0) {
    ppdVar4 = TPZVec<double_*>::operator[](in_RDX,0);
    *ppdVar4 = (double *)0x0;
  }
  else {
    pdVar3 = TPZVec<double>::operator[](in_RSI,0);
    ppdVar4 = TPZVec<double_*>::operator[](in_RDX,0);
    *ppdVar4 = pdVar3;
    pdVar3 = TPZVec<double>::operator[](in_RSI,0);
    pdVar3 = pdVar3 + iVar2;
    ppdVar4 = TPZVec<double_*>::operator[](in_RDX,index);
    *ppdVar4 = pdVar3;
  }
  for (local_38 = 1; local_38 < index + 1; local_38 = local_38 + 1) {
    ppdVar4 = TPZVec<double_*>::operator[](in_RDX,local_38 + -1);
    pdVar3 = *ppdVar4;
    plVar5 = TPZVec<long>::operator[](in_RDI,local_38 + -1);
    lVar1 = *plVar5;
    ppdVar4 = TPZVec<double_*>::operator[](in_RDX,local_38);
    *ppdVar4 = pdVar3 + (local_38 - lVar1);
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::InitializeElem(const TPZVec<int64_t> &skyline, TPZVec<TVar> &storage, TPZVec<TVar *> &point) {   // JORGE 2013 OUTUBRO ???
	int64_t dim = skyline.NElements();
	int64_t nel = NumElements(skyline);
#ifdef PZDEBUG
    //	std::cout << "Skyline Matrix, Number of elements : " << nel << " in floating point " << nel*sizeof(TVar) << std::endl;
#endif
	storage.Resize(nel);
	storage.Fill(0.);
	int64_t i;
	point.Resize(dim+1);
	if(dim) {
		point[0] = &storage[0];
		point[dim] = &storage[0]+nel;
	} else {
		point[0] = 0;
	}
	for(i=1; i<dim+1; i++)
		point[i] = point[i-1]+(i-1)-skyline[i-1]+1;
}